

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  telnet_state_t tVar1;
  telnet_error_t tVar2;
  int in_R8D;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  byte bStack_99;
  telnet_t *ptStack_98;
  char *pcStack_68;
  char *pcStack_60;
  telnet_event_t tStack_58;
  
  sVar6 = 0;
  lVar4 = 0;
  ptStack_98 = telnet;
  pcStack_68 = buffer;
  pcStack_60 = (char *)size;
  do {
    if (pcStack_60 == (char *)sVar6) {
      if ((telnet->state == TELNET_STATE_DATA) &&
         (pcStack_60 = (char *)((long)pcStack_60 - lVar4), pcStack_60 != (char *)0x0)) {
        tStack_58.type = TELNET_EV_DATA;
        tStack_58.data.buffer = pcStack_68 + lVar4;
        tStack_58.data.size = (size_t)pcStack_60;
        (*telnet->eh)(telnet,&tStack_58,telnet->ud);
      }
      return;
    }
    bStack_99 = pcStack_68[sVar6];
    tVar1 = telnet->state;
    if (TELNET_STATE_SB_DATA_IAC < tVar1) goto LAB_001022a3;
    uVar5 = (uint)bStack_99;
    switch(tVar1) {
    case TELNET_STATE_DATA:
      if (uVar5 == 0xd) {
        if ((telnet->flags & 0x42) == 2) {
          if ((char *)(sVar6 - lVar4) != (char *)0x0) {
            tStack_58.type = TELNET_EV_DATA;
            tStack_58.data.buffer = pcStack_68 + lVar4;
            tStack_58.data.size = (size_t)(char *)(sVar6 - lVar4);
            (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          }
          telnet->state = TELNET_STATE_EOL;
        }
      }
      else if (uVar5 == 0xff) {
        if ((char *)(sVar6 - lVar4) != (char *)0x0) {
          tStack_58.type = TELNET_EV_DATA;
          tStack_58.data.buffer = pcStack_68 + lVar4;
          tStack_58.data.size = (size_t)(char *)(sVar6 - lVar4);
          (*telnet->eh)(telnet,&tStack_58,telnet->ud);
        }
        telnet->state = TELNET_STATE_IAC;
      }
      break;
    case TELNET_STATE_EOL:
      if (bStack_99 == 10) {
        uVar3 = 0;
      }
      else {
        tStack_58.type = TELNET_EV_DATA;
        bStack_99 = 0xd;
        tStack_58.data.buffer = (char *)&bStack_99;
        tStack_58.data.size = 1;
        (*telnet->eh)(telnet,&tStack_58,telnet->ud);
        bStack_99 = pcStack_68[sVar6];
        uVar3 = (ulong)(bStack_99 == 0);
      }
      lVar4 = uVar3 + sVar6;
      goto LAB_0010229f;
    case TELNET_STATE_IAC:
      switch(uVar5) {
      case 0xfa:
        telnet->state = TELNET_STATE_SB;
        break;
      case 0xfb:
        telnet->state = TELNET_STATE_WILL;
        break;
      case 0xfc:
        telnet->state = TELNET_STATE_WONT;
        break;
      case 0xfd:
        telnet->state = TELNET_STATE_DO;
        break;
      case 0xfe:
        telnet->state = TELNET_STATE_DONT;
        break;
      case 0xff:
        tStack_58.type = TELNET_EV_DATA;
        tStack_58.data.buffer = (char *)&bStack_99;
        tStack_58.data.size = 1;
        goto LAB_00101ffb;
      default:
        tStack_58.type = TELNET_EV_IAC;
        tStack_58.iac.cmd = bStack_99;
LAB_00101ffb:
        (*telnet->eh)(telnet,&tStack_58,telnet->ud);
LAB_0010200a:
        lVar4 = sVar6 + 1;
LAB_0010229f:
        telnet->state = TELNET_STATE_DATA;
      }
      break;
    default:
      if ((telnet->flags & 1) != 0) {
        (*(code *)(&DAT_00104568 + *(int *)(&DAT_00104568 + (ulong)(tVar1 - TELNET_STATE_WILL) * 4))
        )();
        return;
      }
      _get_rfc1143(telnet,bStack_99);
      (*(code *)(&DAT_00104578 + *(int *)(&DAT_00104578 + (ulong)(tVar1 - TELNET_STATE_WILL) * 4)))
                ();
      return;
    case TELNET_STATE_SB:
      telnet->sb_telopt = bStack_99;
      telnet->buffer_pos = 0;
LAB_00101cfb:
      telnet->state = TELNET_STATE_SB_DATA;
      break;
    case TELNET_STATE_SB_DATA:
      if (bStack_99 == 0xff) {
        telnet->state = TELNET_STATE_SB_DATA_IAC;
      }
      else {
        if (bStack_99 == 0xfb && telnet->sb_telopt == 'U') {
          lVar4 = sVar6 + 2;
          goto LAB_0010229f;
        }
        tVar2 = _buffer_byte(telnet,bStack_99);
        if (tVar2 != TELNET_EOK) goto LAB_0010200a;
      }
      break;
    case TELNET_STATE_SB_DATA_IAC:
      if (uVar5 != 0xff) {
        if (uVar5 == 0xf0) {
          lVar4 = sVar6 + 1;
          telnet->state = TELNET_STATE_DATA;
          _subnegotiate(telnet);
        }
        else {
          _error(telnet,0x472,"_process",TELNET_EPROTOCOL,in_R8D,
                 "unexpected byte after IAC inside SB: %d",uVar5);
          telnet->state = TELNET_STATE_IAC;
          _subnegotiate(telnet);
          lVar4 = sVar6 + 1;
          _process(telnet,(char *)&bStack_99,1);
        }
        break;
      }
      tVar2 = _buffer_byte(telnet,0xff);
      if (tVar2 == TELNET_EOK) goto LAB_00101cfb;
      goto LAB_0010200a;
    }
LAB_001022a3:
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}